

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::SelectConstant<float,float,duckdb::Equals>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  bool bVar4;
  idx_t iVar5;
  sel_t sVar6;
  
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if ((((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
      ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
       puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) &&
     (bVar4 = duckdb::Equals::Operation<float>((float *)left->data,(float *)right->data), bVar4)) {
    if (count != 0 && true_sel != (SelectionVector *)0x0) {
      psVar2 = sel->sel_vector;
      psVar3 = true_sel->sel_vector;
      iVar5 = 0;
      do {
        sVar6 = (sel_t)iVar5;
        if (psVar2 != (sel_t *)0x0) {
          sVar6 = psVar2[iVar5];
        }
        psVar3[iVar5] = sVar6;
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  else {
    if (count != 0 && false_sel != (SelectionVector *)0x0) {
      psVar2 = sel->sel_vector;
      psVar3 = false_sel->sel_vector;
      iVar5 = 0;
      do {
        sVar6 = (sel_t)iVar5;
        if (psVar2 != (sel_t *)0x0) {
          sVar6 = psVar2[iVar5];
        }
        psVar3[iVar5] = sVar6;
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
    count = 0;
  }
  return count;
}

Assistant:

static idx_t SelectConstant(Vector &left, Vector &right, const SelectionVector *sel, idx_t count,
	                            SelectionVector *true_sel, SelectionVector *false_sel) {
		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);

		// both sides are constant, return either 0 or the count
		// in this case we do not fill in the result selection vector at all
		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right) || !OP::Operation(*ldata, *rdata)) {
			if (false_sel) {
				for (idx_t i = 0; i < count; i++) {
					false_sel->set_index(i, sel->get_index(i));
				}
			}
			return 0;
		} else {
			if (true_sel) {
				for (idx_t i = 0; i < count; i++) {
					true_sel->set_index(i, sel->get_index(i));
				}
			}
			return count;
		}
	}